

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * valueToText(sqlite3_value *pVal,u8 enc)

{
  ushort uVar1;
  int iVar2;
  
  uVar1 = pVal->flags;
  if ((uVar1 & 0x12) == 0) {
    sqlite3VdbeMemStringify(pVal,enc,'\0');
  }
  else {
    if ((uVar1 >> 0xe & 1) != 0) {
      iVar2 = sqlite3VdbeMemExpandBlob(pVal);
      if (iVar2 != 0) {
        return (void *)0x0;
      }
      uVar1 = pVal->flags;
    }
    pVal->flags = uVar1 | 2;
    if ((enc & 0xf7) != (uint)pVal->enc) {
      sqlite3VdbeChangeEncoding(pVal,enc & 0xf7);
    }
    if ((((enc & 8) != 0) && (((ulong)pVal->z & 1) != 0)) &&
       (iVar2 = sqlite3VdbeMemMakeWriteable(pVal), iVar2 != 0)) {
      return (void *)0x0;
    }
    sqlite3VdbeMemNulTerminate(pVal);
  }
  if (pVal->enc != (enc & 0xf7)) {
    return (void *)0x0;
  }
  return pVal->z;
}

Assistant:

static SQLITE_NOINLINE const void *valueToText(sqlite3_value* pVal, u8 enc){
  assert( pVal!=0 );
  assert( pVal->db==0 || sqlite3_mutex_held(pVal->db->mutex) );
  assert( (enc&3)==(enc&~SQLITE_UTF16_ALIGNED) );
  assert( !sqlite3VdbeMemIsRowSet(pVal) );
  assert( (pVal->flags & (MEM_Null))==0 );
  if( pVal->flags & (MEM_Blob|MEM_Str) ){
    if( ExpandBlob(pVal) ) return 0;
    pVal->flags |= MEM_Str;
    if( pVal->enc != (enc & ~SQLITE_UTF16_ALIGNED) ){
      sqlite3VdbeChangeEncoding(pVal, enc & ~SQLITE_UTF16_ALIGNED);
    }
    if( (enc & SQLITE_UTF16_ALIGNED)!=0 && 1==(1&SQLITE_PTR_TO_INT(pVal->z)) ){
      assert( (pVal->flags & (MEM_Ephem|MEM_Static))!=0 );
      if( sqlite3VdbeMemMakeWriteable(pVal)!=SQLITE_OK ){
        return 0;
      }
    }
    sqlite3VdbeMemNulTerminate(pVal); /* IMP: R-31275-44060 */
  }else{
    sqlite3VdbeMemStringify(pVal, enc, 0);
    assert( 0==(1&SQLITE_PTR_TO_INT(pVal->z)) );
  }
  assert(pVal->enc==(enc & ~SQLITE_UTF16_ALIGNED) || pVal->db==0
              || pVal->db->mallocFailed );
  if( pVal->enc==(enc & ~SQLITE_UTF16_ALIGNED) ){
    assert( sqlite3VdbeMemValidStrRep(pVal) );
    return pVal->z;
  }else{
    return 0;
  }
}